

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O3

bool __thiscall
mylanguage_driver::parse_stream(mylanguage_driver *this,istream *in,cstref sname,ostream *out)

{
  int iVar1;
  undefined1 local_360 [8];
  mylanguage_lexer scanner;
  mylanguage_parser parser;
  
  std::__cxx11::string::_M_assign((string *)(this + 8));
  yyFlexLexer::yyFlexLexer((yyFlexLexer *)local_360,in,(ostream *)0x0);
  local_360 = (undefined1  [8])&PTR__yyFlexLexer_0010ea50;
  scanner.super_yyFlexLexer.yy_prev_more_offset = 0;
  scanner.super_yyFlexLexer._732_4_ = 0;
  scanner.loc.begin.filename = (filename_type *)0x100000001;
  scanner.loc.begin.line = 0;
  scanner.loc.begin.column = 0;
  scanner.loc.end.filename = (filename_type *)0x100000001;
  scanner.super_yyFlexLexer.super_FlexLexer.yyleng = (int)(byte)this[0x30];
  *(yyFlexLexer **)(this + 0x28) = (yyFlexLexer *)local_360;
  yy::mylanguage_parser::mylanguage_parser((mylanguage_parser *)&scanner.loc.end.line,this);
  yy::mylanguage_parser::set_debug_level
            ((mylanguage_parser *)&scanner.loc.end.line,(uint)(byte)this[0x31]);
  iVar1 = yy::mylanguage_parser::parse((mylanguage_parser *)&scanner.loc.end.line);
  *(undefined8 *)(this + 0x28) = 0;
  yy::mylanguage_parser::~mylanguage_parser((mylanguage_parser *)&scanner.loc.end.line);
  yyFlexLexer::~yyFlexLexer((yyFlexLexer *)local_360);
  return iVar1 == 0;
}

Assistant:

bool mylanguage_driver::parse_stream(istream& in, cstref sname, ostream& out)
{
    //reset();
    streamname = sname;
    mylanguage_lexer scanner(&in);
    scanner.set_debug(trace_scanning);
    lexer = &scanner;
    yy::mylanguage_parser parser(*this);
    parser.set_debug_level(trace_parsing);
    bool success = parser.parse() == 0;
    lexer = nullptr; // it's only active on the stack
    return success;
}